

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate_code.cc
# Opt level: O3

void re2c::Skeleton::emit_epilog
               (OutputFile *o,
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *names)

{
  OutputFile *pOVar1;
  _Rb_tree_node_base *p_Var2;
  
  pOVar1 = OutputFile::ws(o,"\n");
  OutputFile::ws(pOVar1,"int main()");
  pOVar1 = OutputFile::ws(o,"\n");
  OutputFile::ws(pOVar1,"{");
  for (p_Var2 = (names->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(names->_M_t)._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    pOVar1 = OutputFile::ws(o,"\n");
    pOVar1 = OutputFile::wind(pOVar1,1);
    pOVar1 = OutputFile::ws(pOVar1,"if(lex_");
    pOVar1 = OutputFile::wstring(pOVar1,(string *)(p_Var2 + 1));
    OutputFile::ws(pOVar1,"() != 0) {");
    pOVar1 = OutputFile::ws(o,"\n");
    pOVar1 = OutputFile::wind(pOVar1,2);
    OutputFile::ws(pOVar1,"return 1;");
    pOVar1 = OutputFile::ws(o,"\n");
    pOVar1 = OutputFile::wind(pOVar1,1);
    OutputFile::ws(pOVar1,"}");
  }
  pOVar1 = OutputFile::ws(o,"\n");
  pOVar1 = OutputFile::wind(pOVar1,1);
  OutputFile::ws(pOVar1,"return 0;");
  OutputFile::ws(o,"\n}");
  OutputFile::ws(o,"\n");
  return;
}

Assistant:

void Skeleton::emit_epilog (OutputFile & o, const std::set<std::string> & names)
{
	o.ws("\n").ws("int main()");
	o.ws("\n").ws("{");

	for (std::set<std::string>::const_iterator i = names.begin (); i != names.end (); ++i)
	{
		o.ws("\n").wind(1).ws("if(lex_").wstring(*i).ws("() != 0) {");
		o.ws("\n").wind(2).ws("return 1;");
		o.ws("\n").wind(1).ws("}");
	}

	o.ws("\n").wind(1).ws("return 0;");
	o.ws("\n}");
	o.ws("\n");
}